

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O2

void __thiscall
despot::LookaheadUpperBound::LookaheadUpperBound
          (LookaheadUpperBound *this,DSPOMDP *model,StateIndexer *indexer,ParticleUpperBound *bound)

{
  ScenarioUpperBound::ScenarioUpperBound(&this->super_ScenarioUpperBound);
  (this->super_ScenarioUpperBound)._vptr_ScenarioUpperBound =
       (_func_int **)&PTR__LookaheadUpperBound_0019b5d0;
  this->model_ = model;
  this->indexer_ = indexer;
  (this->bounds_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bounds_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bounds_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->particle_upper_bound_ = bound;
  return;
}

Assistant:

LookaheadUpperBound::LookaheadUpperBound(const DSPOMDP* model,
	const StateIndexer& indexer, ParticleUpperBound* bound) :
	model_(model),
	indexer_(indexer),
	particle_upper_bound_(bound) {
}